

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

LBDOperator * lts2::CreateLbdOperator(int lbdType,int M)

{
  int M_local;
  int lbdType_local;
  
  switch(lbdType) {
  case 0:
  default:
    _M_local = CreateFreakOperator(M);
    break;
  case 1:
    _M_local = CreateRandomFreakOperator(M);
    break;
  case 2:
    _M_local = CreateBriefOperator(M);
    break;
  case 3:
    _M_local = CreateExFreakOperator(M);
  }
  return _M_local;
}

Assistant:

lts2::LBDOperator *lts2::CreateLbdOperator(int lbdType, int M)
{
  switch (lbdType)
  {
  case (int)lbd::LBD_TYPE::eTypeExFreak:
    return lts2::CreateExFreakOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeBrief:
    return lts2::CreateBriefOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeRandomFreak:
    return lts2::CreateRandomFreakOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeFreak:
  default:
    return lts2::CreateFreakOperator(M);
    break;
  }
}